

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O2

Gia_Man_t * Mf_ManDeriveMappingGia(Mf_Man_t *p)

{
  Gia_Man_t *p_00;
  Vec_Mem_t *p_01;
  int iVar1;
  int iVar2;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Vec_Int_t *p_04;
  Vec_Int_t *p_05;
  Vec_Int_t *p_06;
  Gia_Man_t *p_07;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  word *pTruth;
  uint uVar6;
  int Fill;
  int Fill_00;
  int iVar7;
  ulong uVar8;
  long lVar9;
  
  p_02 = Vec_IntStartFull(p->pGia->nObjs);
  p_03 = Vec_IntStart((p->pGia->nObjs + (int)p->pPars->Area) * 2 + (int)p->pPars->Edge);
  p_04 = Vec_IntStart((int)p->pPars->Edge + (int)p->pPars->Area * 2 + 1000);
  p_05 = Vec_IntAlloc(0x10000);
  p_06 = Vec_IntAlloc(0x10);
  if (p->pPars->fCutMin == 0) {
    __assert_fail("p->pPars->fCutMin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                  ,0x514,"Gia_Man_t *Mf_ManDeriveMappingGia(Mf_Man_t *)");
  }
  p_07 = Gia_ManStart(p->pGia->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pGia->pName);
  p_07->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pGia->pSpec);
  p_07->pSpec = pcVar3;
  Vec_IntWriteEntry(p_02,0,0);
  for (iVar7 = 0; p_00 = p->pGia, iVar7 < p_00->vCis->nSize; iVar7 = iVar7 + 1) {
    pGVar4 = Gia_ManCi(p_00,iVar7);
    iVar1 = Gia_ObjId(p_00,pGVar4);
    if (iVar1 == 0) break;
    iVar2 = Gia_ManAppendCi(p_07);
    Vec_IntWriteEntry(p_02,iVar1,iVar2);
  }
  for (lVar9 = 0; lVar9 < p->pGia->nObjs; lVar9 = lVar9 + 1) {
    iVar7 = (int)lVar9;
    pGVar4 = Gia_ManObj(p->pGia,iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if (((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) &&
       (0xffff < *(uint *)&p->pLfObjs[lVar9].field_0xc)) {
      piVar5 = Mf_ObjCutSet(p,iVar7);
      uVar6 = piVar5[1];
      if ((uVar6 & 0x1f) == 1) {
        iVar1 = Abc_Lit2Var(uVar6 >> 5);
        if (iVar1 != 1) {
          __assert_fail("Abc_Lit2Var(Mf_CutFunc(pCut)) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                        ,0x52b,"Gia_Man_t *Mf_ManDeriveMappingGia(Mf_Man_t *)");
        }
        iVar1 = Vec_IntEntry(p_02,piVar5[2]);
        iVar2 = Abc_LitIsCompl((uint)piVar5[1] >> 5);
        uVar6 = Abc_LitNotCond(iVar1,iVar2);
      }
      else {
        if ((uVar6 & 0x1f) != 0) {
          p_06->nSize = 0;
          for (uVar8 = 1; uVar8 <= (piVar5[1] & 0x1f); uVar8 = uVar8 + 1) {
            iVar1 = Vec_IntEntry(p_02,piVar5[uVar8 + 1]);
            Vec_IntPush(p_06,iVar1);
          }
          p_01 = p->vTtMem;
          iVar1 = Abc_Lit2Var((uint)piVar5[1] >> 5);
          pTruth = Vec_MemReadEntry(p_01,iVar1);
          iVar1 = Kit_TruthToGia(p_07,(uint *)pTruth,p_06->nSize,p_05,p_06,0);
          iVar2 = Abc_LitIsCompl((uint)piVar5[1] >> 5);
          iVar2 = Abc_LitNotCond(iVar1,iVar2);
          Vec_IntWriteEntry(p_02,iVar7,iVar2);
          iVar2 = Abc_Lit2Var(iVar1);
          iVar1 = p_04->nSize;
          Vec_IntFillExtra(p_03,iVar2 + 1,Fill);
          Vec_IntWriteEntry(p_03,iVar2,iVar1);
          Vec_IntPush(p_04,p_06->nSize);
          for (iVar1 = 0; iVar1 < p_06->nSize; iVar1 = iVar1 + 1) {
            iVar2 = Vec_IntEntry(p_06,iVar1);
            iVar2 = Abc_Lit2Var(iVar2);
            Vec_IntPush(p_04,iVar2);
          }
          iVar7 = Vec_IntEntry(p_02,iVar7);
          iVar7 = Abc_Lit2Var(iVar7);
          Vec_IntPush(p_04,iVar7);
          goto LAB_005f969d;
        }
        iVar1 = Abc_Lit2Var(uVar6 >> 5);
        if (iVar1 != 0) {
          __assert_fail("Abc_Lit2Var(Mf_CutFunc(pCut)) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                        ,0x525,"Gia_Man_t *Mf_ManDeriveMappingGia(Mf_Man_t *)");
        }
        uVar6 = (uint)piVar5[1] >> 5;
      }
      Vec_IntWriteEntry(p_02,iVar7,uVar6);
    }
LAB_005f969d:
  }
  for (iVar7 = 0; iVar7 < p->pGia->vCos->nSize; iVar7 = iVar7 + 1) {
    pGVar4 = Gia_ManCo(p->pGia,iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjFaninId0p(p->pGia,pGVar4);
    iVar1 = Vec_IntEntry(p_02,iVar1);
    iVar1 = Abc_LitNotCond(iVar1,*(uint *)pGVar4 >> 0x1d & 1);
    Gia_ManAppendCo(p_07,iVar1);
  }
  Vec_IntFree(p_02);
  Vec_IntFree(p_05);
  Vec_IntFree(p_06);
  iVar7 = p_07->nObjs;
  if (iVar7 < p_03->nSize) {
    p_03->nSize = iVar7;
  }
  else {
    Vec_IntFillExtra(p_03,iVar7,Fill_00);
    iVar7 = p_07->nObjs;
    if (p_03->nSize != iVar7) {
      __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                    ,0x54a,"Gia_Man_t *Mf_ManDeriveMappingGia(Mf_Man_t *)");
    }
  }
  for (iVar1 = 0; iVar1 < iVar7; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(p_03,iVar1);
    if (0 < iVar2) {
      Vec_IntAddToEntry(p_03,iVar1,p_07->nObjs);
    }
  }
  iVar7 = p_04->nSize;
  iVar1 = 0;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  for (; iVar7 != iVar1; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(p_04,iVar1);
    Vec_IntPush(p_03,iVar2);
  }
  Vec_IntFree(p_04);
  if (p_07->vMapping == (Vec_Int_t *)0x0) {
    p_07->vMapping = p_03;
    Gia_ManSetRegNum(p_07,p->pGia->nRegs);
    return p_07;
  }
  __assert_fail("pNew->vMapping == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                ,0x551,"Gia_Man_t *Mf_ManDeriveMappingGia(Mf_Man_t *)");
}

Assistant:

Gia_Man_t * Mf_ManDeriveMappingGia( Mf_Man_t * p )
{
    Gia_Man_t * pNew; 
    Gia_Obj_t * pObj; 
    Vec_Int_t * vCopies   = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vMapping  = Vec_IntStart( 2 * Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + 2 * (int)p->pPars->Area );
    Vec_Int_t * vMapping2 = Vec_IntStart( (int)p->pPars->Edge + 2 * (int)p->pPars->Area + 1000 );
    Vec_Int_t * vCover    = Vec_IntAlloc( 1 << 16 );
    Vec_Int_t * vLeaves   = Vec_IntAlloc( 16 );
    int i, k, Id, iLit, * pCut;
    word uTruth = 0, * pTruth = &uTruth;
    assert( p->pPars->fCutMin );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p->pGia) );
    pNew->pName = Abc_UtilStrsav( p->pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pGia->pSpec );
    // map primary inputs
    Vec_IntWriteEntry( vCopies, 0, 0 );
    Gia_ManForEachCiId( p->pGia, Id, i )
        Vec_IntWriteEntry( vCopies, Id, Gia_ManAppendCi(pNew) );
    // iterate through nodes used in the mapping
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( !Mf_ObjMapRefNum(p, i) )
            continue;
        pCut = Mf_ObjCutBest( p, i );
        if ( Mf_CutSize(pCut) == 0 )
        {
            assert( Abc_Lit2Var(Mf_CutFunc(pCut)) == 0 );
            Vec_IntWriteEntry( vCopies, i, Mf_CutFunc(pCut) );
            continue;
        }
        if ( Mf_CutSize(pCut) == 1 )
        {
            assert( Abc_Lit2Var(Mf_CutFunc(pCut)) == 1 );
            iLit = Vec_IntEntry( vCopies, pCut[1] );
            Vec_IntWriteEntry( vCopies, i, Abc_LitNotCond(iLit, Abc_LitIsCompl(Mf_CutFunc(pCut))) );
            continue;
        }
        Vec_IntClear( vLeaves );
        for ( k = 1; k <= Mf_CutSize(pCut); k++ )
            Vec_IntPush( vLeaves, Vec_IntEntry(vCopies, pCut[k]) );
        pTruth = Vec_MemReadEntry( p->vTtMem, Abc_Lit2Var(Mf_CutFunc(pCut)) );
        iLit = Kit_TruthToGia( pNew, (unsigned *)pTruth, Vec_IntSize(vLeaves), vCover, vLeaves, 0 );
        Vec_IntWriteEntry( vCopies, i, Abc_LitNotCond(iLit, Abc_LitIsCompl(Mf_CutFunc(pCut))) );
        // create mapping
        Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLit), Vec_IntSize(vMapping2) );
        Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
        Vec_IntForEachEntry( vLeaves, iLit, k )
            Vec_IntPush( vMapping2, Abc_Lit2Var(iLit) );
        Vec_IntPush( vMapping2, Abc_Lit2Var(Vec_IntEntry(vCopies, i)) );
    }
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
        iLit = Gia_ManAppendCo( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
    }
    Vec_IntFree( vCopies );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, iLit, i )
        if ( iLit > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    pNew->vMapping = vMapping;
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p->pGia) );
    return pNew;
}